

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.h
# Opt level: O1

void llvm::format_provider<llvm::dwarf::Form,_void>::format(Form *E,raw_ostream *OS,StringRef Style)

{
  raw_ostream *prVar1;
  StringRef SVar2;
  StringRef Str;
  StringRef Str_00;
  format_object_base local_30;
  Form local_20;
  
  SVar2 = dwarf::FormEncodingString((uint)*E);
  if (SVar2.Length != 0) {
    raw_ostream::operator<<(OS,SVar2);
    return;
  }
  SVar2.Length = 3;
  SVar2.Data = "DW_";
  prVar1 = raw_ostream::operator<<(OS,SVar2);
  Str.Length = 4;
  Str.Data = "FORM";
  prVar1 = raw_ostream::operator<<(prVar1,Str);
  Str_00.Length = 9;
  Str_00.Data = "_unknown_";
  prVar1 = raw_ostream::operator<<(prVar1,Str_00);
  local_30.Fmt = "%x";
  local_30._vptr_format_object_base = (_func_int **)&PTR_home_01097da0;
  local_20 = *E;
  raw_ostream::operator<<(prVar1,&local_30);
  return;
}

Assistant:

static void format(const Enum &E, raw_ostream &OS, StringRef Style) {
    StringRef Str = dwarf::EnumTraits<Enum>::StringFn(E);
    if (Str.empty()) {
      OS << "DW_" << dwarf::EnumTraits<Enum>::Type << "_unknown_"
         << llvm::format("%x", E);
    } else
      OS << Str;
  }